

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

Values * __thiscall
dynamicgraph::command::Value::valuesValue(Values *__return_storage_ptr__,Value *this)

{
  ExceptionAbstract *this_00;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  Value *local_18;
  Value *this_local;
  
  local_18 = this;
  this_local = (Value *)__return_storage_ptr__;
  if (this->type_ == VALUES) {
    std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::vector
              (__return_storage_ptr__,
               (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                *)this->value_);
    return __return_storage_ptr__;
  }
  this_00 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
  local_1c = 700;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"value is not a vector of Value",&local_41);
  ExceptionAbstract::ExceptionAbstract(this_00,&local_1c,&local_40);
  __cxa_throw(this_00,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

Values Value::valuesValue() const {
  if (type_ == VALUES) return *((const Values *)value_);
  throw ExceptionAbstract(ExceptionAbstract::TOOLS,
                          "value is not a vector of Value");
}